

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

ChainstateRole __thiscall Chainstate::GetRole(Chainstate *this)

{
  ChainstateRole CVar1;
  Chainstate *pCVar2;
  long in_FS_OFFSET;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ChainstateManager::GetAll(&local_30,this->m_chainman);
  if (local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  CVar1 = NORMAL;
  if (8 < (ulong)((long)local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_30.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
    pCVar2 = ChainstateManager::ActiveChainstate(this->m_chainman);
    CVar1 = (pCVar2 == this) + BACKGROUND;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return CVar1;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateRole Chainstate::GetRole() const
{
    if (m_chainman.GetAll().size() <= 1) {
        return ChainstateRole::NORMAL;
    }
    return (this != &m_chainman.ActiveChainstate()) ?
               ChainstateRole::BACKGROUND :
               ChainstateRole::ASSUMEDVALID;
}